

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageOrderModification.cpp
# Opt level: O2

EStatusCode
AddPageToNewTree(unsigned_long inPageIndex,PDFWriter *inWriter,
                PDFDocumentCopyingContext *inCopyingContext)

{
  PDFDocumentCopyingContext *this;
  bool bVar1;
  EStatusCode EVar2;
  DocumentContext *this_00;
  CatalogInformation *this_01;
  ObjectsContext *pOVar3;
  IndirectObjectsReferenceRegistry *inObjectsRegistry;
  PDFParser *this_02;
  ObjectIDType OVar4;
  ObjectIDType OVar5;
  PDFDictionary *inOriginal;
  DictionaryContext *this_03;
  string *psVar6;
  PDFObjectCastPtr<PDFDictionary> pageDictionaryObject;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  pageDictionaryObjectIt;
  allocator<char> local_89;
  ObjectIDType local_88;
  PDFDocumentCopyingContext *local_80;
  RefCountPtr<PDFDictionary> local_78;
  ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_68;
  string local_50;
  
  local_80 = inCopyingContext;
  this_00 = PDFWriter::GetDocumentContext(inWriter);
  this_01 = PDFHummus::DocumentContext::GetCatalogInformation(this_00);
  pOVar3 = PDFWriter::GetObjectsContext(inWriter);
  inObjectsRegistry = ObjectsContext::GetInDirectObjectsRegistry(pOVar3);
  this_02 = PDFWriter::GetModifiedFileParser(inWriter);
  OVar4 = PDFParser::GetPageObjectID(this_02,inPageIndex);
  OVar5 = CatalogInformation::AddPageToPageTree(this_01,OVar4,inObjectsRegistry);
  inOriginal = PDFParser::ParsePage(this_02,inPageIndex);
  local_78.mValue = PDFObjectCast<PDFDictionary>(&inOriginal->super_PDFObject);
  local_78._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8c0;
  PDFDictionary::GetIterator
            ((MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              *)&local_68,local_78.mValue);
  pOVar3 = PDFWriter::GetObjectsContext(inWriter);
  EVar2 = ObjectsContext::StartModifiedIndirectObject(pOVar3,OVar4);
  this = local_80;
  if (EVar2 == eSuccess) {
    this_03 = ObjectsContext::StartDictionary(pOVar3);
    local_88 = OVar5;
    while( true ) {
      bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              ::MoveNext(&local_68);
      if (!bVar1) break;
      psVar6 = PDFName::GetValue_abi_cxx11_(*(PDFName **)(local_68.mCurrentPosition._M_node + 1));
      bVar1 = std::operator!=(psVar6,"Parent");
      if (bVar1) {
        psVar6 = PDFName::GetValue_abi_cxx11_(*(PDFName **)(local_68.mCurrentPosition._M_node + 1));
        DictionaryContext::WriteKey(this_03,psVar6);
        PDFDocumentCopyingContext::CopyDirectObjectAsIs
                  (this,(PDFObject *)local_68.mCurrentPosition._M_node[1]._M_parent);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Parent",&local_89);
    DictionaryContext::WriteKey(this_03,&local_50);
    OVar4 = local_88;
    std::__cxx11::string::~string((string *)&local_50);
    DictionaryContext::WriteNewObjectReferenceValue(this_03,OVar4);
    ObjectsContext::EndDictionary(pOVar3,this_03);
    ObjectsContext::EndIndirectObject(pOVar3);
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start modified page object\n");
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_78);
  return EVar2;
}

Assistant:

static EStatusCode AddPageToNewTree(unsigned long inPageIndex, PDFWriter& inWriter, PDFDocumentCopyingContext* inCopyingContext) {
	CatalogInformation& catalogInformation = inWriter.GetDocumentContext().GetCatalogInformation();
	IndirectObjectsReferenceRegistry& objectsRegistry = inWriter.GetObjectsContext().GetInDirectObjectsRegistry();
	PDFParser& modifiedFileParser = inWriter.GetModifiedFileParser();

	ObjectIDType pageObjectId = modifiedFileParser.GetPageObjectID(inPageIndex);

	// re-add the page to the new page tree
	ObjectIDType newParent =  catalogInformation.AddPageToPageTree(pageObjectId, objectsRegistry);

	// now modify the page object to refer to the new parent
	PDFObjectCastPtr<PDFDictionary> pageDictionaryObject = modifiedFileParser.ParsePage(inPageIndex);
	MapIterator<PDFNameToPDFObjectMap>  pageDictionaryObjectIt = pageDictionaryObject->GetIterator();
	ObjectsContext& objectContext = inWriter.GetObjectsContext();


	EStatusCode status = objectContext.StartModifiedIndirectObject(pageObjectId);
	if(status != eSuccess) {
		cout<<"failed to start modified page object\n";
		return status;
	}
	DictionaryContext* modifiedPageObject = objectContext.StartDictionary();

	// copy all elements of the page to the new page object, but the "Parent" element
	while (pageDictionaryObjectIt.MoveNext())
	{
		if (pageDictionaryObjectIt.GetKey()->GetValue() != "Parent")
		{
			modifiedPageObject->WriteKey(pageDictionaryObjectIt.GetKey()->GetValue());
			inCopyingContext->CopyDirectObjectAsIs(pageDictionaryObjectIt.GetValue());
		}
	}

	// now add parent entry
	modifiedPageObject->WriteKey("Parent");
	modifiedPageObject->WriteNewObjectReferenceValue(newParent);

	objectContext.EndDictionary(modifiedPageObject);
	objectContext.EndIndirectObject();

	return status;

}